

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

bool genVulkanFunctionsH(QList<VkSpecParser::Command> *commands,
                        QMap<QString,_QList<QString>_> *versionCommandMapping,QString *licHeaderFn,
                        QString *outputBase)

{
  bool bVar1;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar2;
  ulong uVar3;
  char *pcVar4;
  Command *pCVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  Command *in_RCX;
  long in_FS_OFFSET;
  QString *dst;
  Command *c;
  QList<VkSpecParser::Command> *__range2;
  QStringList *coreFunctionsInVersion;
  QString *version;
  QStringList *__range1;
  char16_t *str_1;
  char16_t *str_2;
  char16_t *str;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  QString devCmdStr;
  QString instCmdStr;
  QFile f;
  undefined4 in_stack_fffffffffffffc98;
  CaseSensitivity in_stack_fffffffffffffc9c;
  enum_type in_stack_fffffffffffffca0;
  enum_type in_stack_fffffffffffffca4;
  QListSpecialMethods<QString> *in_stack_fffffffffffffca8;
  QMessageLogger *in_stack_fffffffffffffcb0;
  QString *in_stack_fffffffffffffcb8;
  QString *in_stack_fffffffffffffcc0;
  QString *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffd00;
  Command *c_00;
  bool local_2d1;
  char local_240 [48];
  QArrayDataPointer<char16_t> local_210 [3];
  QArrayDataPointer<char16_t> local_1c8 [2];
  Command *local_198;
  const_iterator local_190;
  const_iterator local_188;
  QStringBuilder<const_char_(&)[5],_const_QString_&> local_180;
  QStringBuilder<const_char_(&)[5],_const_QString_&> local_158;
  QString *local_118;
  const_iterator local_110;
  const_iterator local_108;
  QString local_100;
  QString local_e8;
  QString local_d0 [2];
  char local_a0 [32];
  QArrayDataPointer<char16_t> local_80 [3];
  undefined1 local_30 [24];
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  c_00 = in_RCX;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_80,(Data *)0x0,L".h",2);
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  operator+((QString *)in_stack_fffffffffffffca8,
            (QString *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
  QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<const_QString_&,_QString> *)
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  QFile::QFile((QFile *)&local_18,(QString *)local_30);
  QString::~QString((QString *)0x105e91);
  QStringBuilder<const_QString_&,_QString>::~QStringBuilder
            ((QStringBuilder<const_QString_&,_QString> *)0x105e9e);
  QString::~QString((QString *)0x105eab);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
  QVar2.i = (Int)operator|(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0);
  uVar3 = QFile::open((QFlags *)&local_18);
  if ((uVar3 & 1) == 0) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca4
               ,(char *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    QFile::fileName();
    QtPrivate::asString(local_d0);
    QString::toLocal8Bit(in_stack_fffffffffffffcb8);
    pcVar4 = QByteArray::constData((QByteArray *)0x105f39);
    QMessageLogger::warning(local_a0,"Failed to write %s",pcVar4);
    QByteArray::~QByteArray((QByteArray *)0x105f5f);
    QString::~QString((QString *)0x105f6c);
    local_2d1 = false;
  }
  else {
    local_e8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_e8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_e8.d.size = -0x5555555555555556;
    QString::QString((QString *)0x105fbb);
    local_100.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_100.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_100.d.size = -0x5555555555555556;
    QString::QString((QString *)0x105ff5);
    local_108.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_108 = QList<QString>::begin
                          ((QList<QString> *)
                           CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    local_110.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_110 = QList<QString>::end((QList<QString> *)
                                    CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    while( true ) {
      local_118 = local_110.i;
      bVar1 = QList<QString>::const_iterator::operator!=(&local_108,local_110);
      if (!bVar1) break;
      QList<QString>::const_iterator::operator*(&local_108);
      QMap<QString,_QList<QString>_>::operator[]
                ((QMap<QString,_QList<QString>_> *)in_stack_fffffffffffffcc0,
                 in_stack_fffffffffffffcb8);
      local_158 = operator+((char (*) [5])
                            CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                            (QString *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)
                           );
      operator+((QStringBuilder<const_char_(&)[5],_const_QString_&> *)
                CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                (char (*) [2])CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      operator+=(in_stack_fffffffffffffcd0,
                 (QStringBuilder<QStringBuilder<const_char_(&)[5],_const_QString_&>,_const_char_(&)[2]>
                  *)in_RCX);
      local_180 = operator+((char (*) [5])
                            CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                            (QString *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)
                           );
      operator+((QStringBuilder<const_char_(&)[5],_const_QString_&> *)
                CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                (char (*) [2])CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      operator+=(in_stack_fffffffffffffcd0,
                 (QStringBuilder<QStringBuilder<const_char_(&)[5],_const_QString_&>,_const_char_(&)[2]>
                  *)in_RCX);
      local_188.i = (Command *)0xaaaaaaaaaaaaaaaa;
      local_188 = QList<VkSpecParser::Command>::begin
                            ((QList<VkSpecParser::Command> *)
                             CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      local_190.i = (Command *)0xaaaaaaaaaaaaaaaa;
      local_190 = QList<VkSpecParser::Command>::end
                            ((QList<VkSpecParser::Command> *)
                             CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      while( true ) {
        local_198 = local_190.i;
        bVar1 = QList<VkSpecParser::Command>::const_iterator::operator!=(&local_188,local_190);
        if (!bVar1) break;
        pCVar5 = QList<VkSpecParser::Command>::const_iterator::operator*(&local_188);
        bVar1 = QListSpecialMethods<QString>::contains
                          (in_stack_fffffffffffffca8,
                           (QString *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                           in_stack_fffffffffffffc9c);
        if (bVar1) {
          if ((pCVar5->deviceLevel & 1U) == 0) {
            in_stack_fffffffffffffcc0 = &local_e8;
          }
          else {
            in_stack_fffffffffffffcc0 = &local_100;
          }
          in_stack_fffffffffffffcd0 = in_stack_fffffffffffffcc0;
          QArrayDataPointer<char16_t>::QArrayDataPointer(local_1c8,(Data *)0x0,L"    ",4);
          QString::QString((QString *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                           (DataPointer *)
                           CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
          QString::operator+=((QString *)
                              CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                              (QString *)
                              CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
          QString::~QString((QString *)0x1062ee);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)
                     CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
          funcSig(c_00,(char *)CONCAT44(QVar2.i,in_stack_fffffffffffffd00));
          QString::operator+=((QString *)
                              CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                              (QString *)
                              CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
          QString::~QString((QString *)0x106330);
          QArrayDataPointer<char16_t>::QArrayDataPointer(local_210,(Data *)0x0,L";\n",2);
          QString::QString((QString *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                           (DataPointer *)
                           CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
          QString::operator+=((QString *)
                              CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                              (QString *)
                              CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
          QString::~QString((QString *)0x1063b1);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)
                     CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
        }
        QList<VkSpecParser::Command>::const_iterator::operator++(&local_188);
      }
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                          (char *)in_stack_fffffffffffffcb8);
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                          (char *)in_stack_fffffffffffffcb8);
      QList<QString>::~QList((QList<QString> *)0x106405);
      QList<QString>::const_iterator::operator++(&local_108);
    }
    pcVar4 = genVulkanFunctionsH::s;
    Preamble::get((Preamble *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    pcVar6 = QByteArray::constData((QByteArray *)0x106449);
    QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    pcVar7 = QByteArray::constData((QByteArray *)0x106470);
    QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    pcVar8 = QByteArray::constData((QByteArray *)0x106497);
    QString::asprintf(local_240,pcVar4,pcVar6,pcVar7,pcVar8);
    QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    QIODevice::write((QByteArray *)&local_18);
    QByteArray::~QByteArray((QByteArray *)0x1064ef);
    QString::~QString((QString *)0x1064fc);
    QByteArray::~QByteArray((QByteArray *)0x106509);
    QByteArray::~QByteArray((QByteArray *)0x106516);
    QByteArray::~QByteArray((QByteArray *)0x106523);
    local_2d1 = true;
    QString::~QString((QString *)0x106540);
    QString::~QString((QString *)0x10654d);
  }
  QFile::~QFile((QFile *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2d1;
}

Assistant:

bool genVulkanFunctionsH(const QList<VkSpecParser::Command> &commands,
                         const QMap<QString, QStringList> &versionCommandMapping,
                         const QString &licHeaderFn,
                         const QString &outputBase)
{
    QFile f(outputBase + QStringLiteral(".h"));
    if (!f.open(QIODevice::WriteOnly | QIODevice::Text)) {
        qWarning("Failed to write %s", qPrintable(f.fileName()));
        return false;
    }

    static const char *s =
"%s\n"
"#ifndef QVULKANFUNCTIONS_H\n"
"#define QVULKANFUNCTIONS_H\n"
"\n"
"#if 0\n"
"#pragma qt_no_master_include\n"
"#endif\n"
"\n"
"#include <QtGui/qtguiglobal.h>\n"
"\n"
"#if QT_CONFIG(vulkan) || defined(Q_QDOC)\n"
"\n"
"#ifndef VK_NO_PROTOTYPES\n"
"#define VK_NO_PROTOTYPES\n"
"#endif\n"
"#include <vulkan/vulkan.h>\n"
"\n"
"#include <QtCore/qscopedpointer.h>\n"
"\n"
"QT_BEGIN_NAMESPACE\n"
"\n"
"class QVulkanInstance;\n"
"class QVulkanFunctionsPrivate;\n"
"class QVulkanDeviceFunctionsPrivate;\n"
"\n"
"class Q_GUI_EXPORT QVulkanFunctions\n"
"{\n"
"public:\n"
"    ~QVulkanFunctions();\n"
"\n"
"%s\n"
"private:\n"
"    Q_DISABLE_COPY(QVulkanFunctions)\n"
"    QVulkanFunctions(QVulkanInstance *inst);\n"
"\n"
"    QScopedPointer<QVulkanFunctionsPrivate> d_ptr;\n"
"    friend class QVulkanInstance;\n"
"};\n"
"\n"
"class Q_GUI_EXPORT QVulkanDeviceFunctions\n"
"{\n"
"public:\n"
"    ~QVulkanDeviceFunctions();\n"
"\n"
"%s\n"
"private:\n"
"    Q_DISABLE_COPY(QVulkanDeviceFunctions)\n"
"    QVulkanDeviceFunctions(QVulkanInstance *inst, VkDevice device);\n"
"\n"
"    QScopedPointer<QVulkanDeviceFunctionsPrivate> d_ptr;\n"
"    friend class QVulkanInstance;\n"
"};\n"
"\n"
"QT_END_NAMESPACE\n"
"\n"
"#endif // QT_CONFIG(vulkan) || defined(Q_QDOC)\n"
"\n"
"#endif // QVULKANFUNCTIONS_H\n";

    QString instCmdStr;
    QString devCmdStr;
    for (const QString &version : VERSIONS) {
        const QStringList &coreFunctionsInVersion = versionCommandMapping[version];
        instCmdStr += "#if " + version + "\n";
        devCmdStr += "#if " + version + "\n";
        for (const VkSpecParser::Command &c : commands) {
            if (!coreFunctionsInVersion.contains(c.cmd.name))
                continue;

            QString *dst = c.deviceLevel ? &devCmdStr : &instCmdStr;
            *dst += QStringLiteral("    ");
            *dst += funcSig(c);
            *dst += QStringLiteral(";\n");
        }
        instCmdStr += "#endif\n";
        devCmdStr += "#endif\n";
    }

    f.write(QString::asprintf(s, preamble.get(licHeaderFn).constData(),
                              instCmdStr.toUtf8().constData(),
                              devCmdStr.toUtf8().constData()).toUtf8());

    return true;
}